

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::MeshGeometry::ReadVertexDataUV
          (MeshGeometry *this,vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *uv_out
          ,Scope *source,string *MappingInformationType,string *ReferenceInformationType)

{
  ResolveVertexDataArray<aiVector2t<float>>
            (uv_out,source,MappingInformationType,ReferenceInformationType,"UV","UVIndex",
             ((long)(this->m_vertices).
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_vertices).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0xc,&this->m_mapping_counts,
             &this->m_mapping_offsets,&this->m_mappings);
  return;
}

Assistant:

void MeshGeometry::ReadVertexDataUV(std::vector<aiVector2D>& uv_out, const Scope& source,
    const std::string& MappingInformationType,
    const std::string& ReferenceInformationType)
{
    ResolveVertexDataArray(uv_out,source,MappingInformationType,ReferenceInformationType,
        "UV",
        "UVIndex",
        m_vertices.size(),
        m_mapping_counts,
        m_mapping_offsets,
        m_mappings);
}